

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  uchar uVar1;
  uchar uVar2;
  short sVar3;
  uchar *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int cx;
  ushort uVar9;
  undefined8 __src;
  int iVar10;
  uint uVar11;
  int num_vertices;
  int iVar12;
  nk_allocator *alloc;
  ulong uVar13;
  stbtt_vertex *vertices;
  ushort *puVar14;
  ushort *puVar15;
  stbtt_vertex *psVar16;
  long lVar17;
  short sVar18;
  int was_off;
  int cy;
  int iVar19;
  ulong uVar20;
  int iVar21;
  stbtt_int32 sVar22;
  byte bVar23;
  short sVar24;
  int sx;
  byte bVar25;
  ushort uVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  ulong uVar32;
  float fVar33;
  float fVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar41;
  float fVar42;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar43;
  float fVar44;
  ulong local_110;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  stbtt__csctx local_a8;
  stbtt__csctx count_ctx;
  ulong uVar31;
  
  if ((info->cff).size == 0) {
    puVar4 = info->data;
    uVar11 = stbtt__GetGlyfOffset(info,glyph_index);
    *pvertices = (stbtt_vertex *)0x0;
    if (-1 < (int)uVar11) {
      uVar13 = (ulong)uVar11;
      uVar9 = CONCAT11(puVar4[uVar13],puVar4[uVar13 + 1]);
      if ((short)uVar9 < 1) {
        if ((short)((ushort)puVar4[uVar13] << 8) < 0) {
          uVar20 = 0;
          vertices = (stbtt_vertex *)0x0;
          puVar14 = (ushort *)(puVar4 + uVar13 + 10);
          for (bVar23 = 1; uVar11 = (uint)uVar20, bVar23 != 0; bVar23 = bVar23 & 0x20) {
            count_ctx.bounds = 0;
            count_ctx.started = 0;
            bVar23 = *(byte *)((long)puVar14 + 1);
            puVar15 = puVar14 + 2;
            fVar33 = 0.0;
            fVar36 = 0.0;
            if ((bVar23 & 2) != 0) {
              if ((bVar23 & 1) == 0) {
                fVar33 = (float)(int)(char)*puVar15;
                fVar36 = (float)(int)((long)((ulong)*(byte *)((long)puVar14 + 5) << 0x38) >> 0x38);
                puVar15 = puVar14 + 3;
              }
              else {
                auVar6._9_7_ = 0;
                auVar6._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
                auVar5._10_6_ = 0;
                auVar5._0_10_ = SUB1610(auVar6 << 0x38,6);
                auVar40._11_5_ = 0;
                auVar40._0_11_ = SUB1611(auVar5 << 0x30,5);
                auVar7._1_12_ = SUB1612(auVar40 << 0x28,4);
                auVar7[0] = (char)puVar14[3];
                auVar7._13_3_ = 0;
                auVar35._1_14_ = SUB1614(auVar7 << 0x18,2);
                auVar35[0] = (char)*puVar15;
                auVar35[0xf] = 0;
                auVar35 = ZEXT416((uint)*(byte *)((long)puVar14 + 7) << 0x10 |
                                  (uint)*(byte *)((long)puVar14 + 5)) | auVar35 << 8;
                fVar33 = (float)(int)auVar35._0_2_;
                fVar36 = (float)(int)auVar35._2_2_;
                puVar15 = puVar14 + 4;
              }
            }
            if ((bVar23 & 8) == 0) {
              if ((bVar23 & 0x40) != 0) {
                uVar9 = *puVar15;
                fVar38 = (float)(int)(short)(puVar15[1] << 8 | puVar15[1] >> 8) * 6.1035156e-05;
                puVar15 = puVar15 + 2;
                _local_d8 = ZEXT416((uint)((float)(int)(short)(uVar9 << 8 | uVar9 >> 8) *
                                          6.1035156e-05));
                goto LAB_0010d938;
              }
              if ((char)bVar23 < '\0') {
                local_d8._0_4_ =
                     (float)(int)CONCAT11((char)*puVar15,*(char *)((long)puVar15 + 1)) *
                     6.1035156e-05;
                local_d8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)puVar15[2],
                                                         *(char *)((long)puVar15 + 5)) << 0x30) >>
                                 0x30) * 6.1035156e-05;
                register0x00001288 = 0;
                local_e8._0_4_ =
                     (float)(int)CONCAT11((char)puVar15[1],*(char *)((long)puVar15 + 3)) *
                     6.1035156e-05;
                local_e8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)puVar15[3],
                                                         *(char *)((long)puVar15 + 7)) << 0x30) >>
                                 0x30) * 6.1035156e-05;
                local_e8._8_8_ = 0;
                puVar15 = puVar15 + 4;
              }
              else {
                _local_d8 = ZEXT812(0x3f800000);
                fStack_cc = 0.0;
                local_e8 = ZEXT816(0x3f80000000000000);
              }
            }
            else {
              fVar38 = (float)(int)(short)(*puVar15 << 8 | *puVar15 >> 8) * 6.1035156e-05;
              puVar15 = puVar15 + 1;
              register0x00001244 = SUB1612((undefined1  [16])0x0,4);
              local_d8._0_4_ = fVar38;
LAB_0010d938:
              local_e8 = ZEXT416((uint)fVar38) << 0x20;
            }
            uVar28 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar14[1] << 8 | puVar14[1] >> 8),
                                         (stbtt_vertex **)&count_ctx);
            __src = count_ctx._0_8_;
            if (0 < (int)uVar28) {
              fVar38 = local_e8._0_4_;
              fVar41 = local_e8._4_4_;
              auVar34._0_4_ = fVar38 * fVar38;
              auVar34._4_4_ = fVar41 * fVar41;
              auVar34._8_4_ = local_e8._8_4_ * local_e8._8_4_;
              auVar34._12_4_ = local_e8._12_4_ * local_e8._12_4_;
              auVar37._0_4_ = (float)local_d8._0_4_ * (float)local_d8._0_4_ + auVar34._0_4_;
              auVar37._4_4_ = (float)local_d8._4_4_ * (float)local_d8._4_4_ + auVar34._4_4_;
              auVar37._8_4_ = fStack_d0 * fStack_d0 + auVar34._8_4_;
              auVar37._12_4_ = fStack_cc * fStack_cc + auVar34._12_4_;
              auVar35 = sqrtps(auVar34,auVar37);
              for (lVar17 = 0; (ulong)uVar28 * 0xe - lVar17 != 0; lVar17 = lVar17 + 0xe) {
                fVar42 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 4 + lVar17) <<
                                            0x30) >> 0x30);
                fVar43 = (float)(int)*(short *)(count_ctx._0_8_ + 2 + lVar17);
                fVar44 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 6 + lVar17) <<
                                            0x30) >> 0x30);
                auVar39._0_4_ =
                     (int)((fVar43 * (float)local_d8._4_4_ +
                            (float)(int)*(short *)(count_ctx._0_8_ + lVar17) * (float)local_d8._0_4_
                           + fVar33) * auVar35._0_4_);
                auVar39._4_4_ =
                     (int)((fVar43 * fVar41 +
                            (float)(int)*(short *)(count_ctx._0_8_ + lVar17) * fVar38 + fVar36) *
                          auVar35._4_4_);
                auVar39._8_4_ =
                     (int)((fVar44 * (float)local_d8._4_4_ + fVar42 * (float)local_d8._0_4_ + fVar33
                           ) * auVar35._0_4_);
                auVar39._12_4_ = (int)((fVar44 * fVar41 + fVar42 * fVar38 + fVar36) * auVar35._4_4_)
                ;
                auVar40 = packssdw(auVar39,auVar39);
                *(long *)(count_ctx._0_8_ + lVar17) = auVar40._0_8_;
              }
              psVar16 = (stbtt_vertex *)
                        (**(code **)((long)info->userdata + 8))
                                  (*info->userdata,0,(ulong)(uVar28 + uVar11) * 0xe);
              if (psVar16 == (stbtt_vertex *)0x0) {
                if (vertices != (stbtt_vertex *)0x0) {
                  (**(code **)((long)info->userdata + 0x10))(*info->userdata,vertices);
                }
                if (__src == 0) {
                  return 0;
                }
                (**(code **)((long)info->userdata + 0x10))(*info->userdata,__src);
                return 0;
              }
              if (0 < (int)uVar11) {
                memcpy(psVar16,vertices,uVar20 * 0xe);
              }
              memcpy(psVar16 + uVar20,(void *)__src,(ulong)uVar28 * 0xe);
              if (vertices != (stbtt_vertex *)0x0) {
                (**(code **)((long)info->userdata + 0x10))(*info->userdata,vertices);
              }
              (**(code **)((long)info->userdata + 0x10))(*info->userdata,__src);
              vertices = psVar16;
              uVar11 = uVar28 + uVar11;
            }
            uVar20 = (ulong)uVar11;
            puVar14 = puVar15;
          }
        }
        else {
          uVar11 = 0;
          vertices = (stbtt_vertex *)0x0;
        }
      }
      else {
        uVar11 = (uint)uVar9 * 2;
        uVar20 = (ulong)uVar11;
        uVar1 = puVar4[uVar20 + uVar13 + 10];
        uVar2 = puVar4[uVar20 + uVar13 + 0xb];
        bVar23 = puVar4[uVar20 + uVar13 + 8];
        bVar25 = puVar4[uVar20 + uVar13 + 9];
        iVar10 = (uint)bVar23 * 0x100 + (uint)bVar25;
        vertices = (stbtt_vertex *)
                   (**(code **)((long)info->userdata + 8))
                             (*info->userdata,0,(iVar10 + (uint)uVar9 * 2) * 0xe + 0xe);
        if (vertices == (stbtt_vertex *)0x0) {
          return 0;
        }
        puVar14 = (ushort *)(puVar4 + (ulong)CONCAT11(uVar1,uVar2) + uVar20 + uVar13 + 0xc);
        uVar20 = uVar20 & 0xffff;
        lVar17 = (ulong)(CONCAT11(bVar23,bVar25) + 1) * 0xe;
        bVar25 = 0;
        bVar23 = 0;
        for (lVar27 = 0; lVar17 - lVar27 != 0; lVar27 = lVar27 + 0xe) {
          if (bVar25 == 0) {
            bVar23 = (byte)*puVar14;
            if ((bVar23 & 8) == 0) {
              puVar14 = (ushort *)((long)puVar14 + 1);
              bVar25 = 0;
            }
            else {
              bVar25 = *(byte *)((long)puVar14 + 1);
              puVar14 = puVar14 + 1;
            }
          }
          else {
            bVar25 = bVar25 - 1;
          }
          (&vertices[uVar20].type)[lVar27] = bVar23;
        }
        sVar24 = 0;
        for (lVar27 = 0; lVar17 - lVar27 != 0; lVar27 = lVar27 + 0xe) {
          bVar23 = (&vertices[uVar20].type)[lVar27];
          if ((bVar23 & 2) == 0) {
            if ((bVar23 & 0x10) == 0) {
              sVar24 = sVar24 + (*puVar14 << 8 | *puVar14 >> 8);
              puVar14 = puVar14 + 1;
            }
          }
          else {
            uVar26 = *puVar14;
            puVar14 = (ushort *)((long)puVar14 + 1);
            uVar9 = -(ushort)(byte)uVar26;
            if ((bVar23 & 0x10) != 0) {
              uVar9 = (ushort)(byte)uVar26;
            }
            sVar24 = sVar24 + uVar9;
          }
          *(short *)((long)&vertices[uVar20].x + lVar27) = sVar24;
        }
        sVar24 = 0;
        for (lVar27 = 0; lVar17 - lVar27 != 0; lVar27 = lVar27 + 0xe) {
          bVar23 = (&vertices[uVar20].type)[lVar27];
          if ((bVar23 & 4) == 0) {
            if ((bVar23 & 0x20) == 0) {
              sVar24 = sVar24 + (*puVar14 << 8 | *puVar14 >> 8);
              puVar14 = puVar14 + 1;
            }
          }
          else {
            uVar9 = *puVar14;
            puVar14 = (ushort *)((long)puVar14 + 1);
            uVar26 = -(ushort)(byte)uVar9;
            if ((bVar23 & 0x20) != 0) {
              uVar26 = (ushort)(byte)uVar9;
            }
            sVar24 = sVar24 + uVar26;
          }
          *(short *)((long)&vertices[uVar20].y + lVar27) = sVar24;
        }
        was_off = 0;
        uVar28 = 0;
        cx = 0;
        local_110 = 0;
        sx = 0;
        uVar20 = 0;
        sVar22 = 0;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_e8._0_8_;
        local_e8 = auVar8 << 0x40;
        iVar29 = 0;
        iVar19 = 0;
        iVar12 = 0;
        num_vertices = 0;
        while( true ) {
          cy = (int)local_110;
          if (iVar10 < iVar12) break;
          lVar17 = (long)(int)(iVar12 + uVar11);
          bVar23 = vertices[lVar17].type;
          sVar24 = vertices[lVar17].x;
          sVar3 = vertices[lVar17].y;
          iVar21 = (int)sVar24;
          uVar30 = (uint)sVar3;
          uVar31 = (ulong)uVar30;
          if (iVar29 == iVar12) {
            if (iVar29 != 0) {
              num_vertices = stbtt__close_shape(vertices,num_vertices,was_off,uVar28,sx,
                                                (stbtt_int32)uVar20,sVar22,local_e8._0_4_,cx,cy);
            }
            uVar20 = uVar31;
            uVar32 = local_e8._0_8_;
            iVar12 = iVar29;
            sx = iVar21;
            if ((bVar23 & 1) == 0) {
              uVar32 = uVar31;
              sVar22 = iVar21;
              if ((vertices[lVar17 + 1].type & 1) == 0) {
                uVar20 = (ulong)(uint)((int)((int)vertices[lVar17 + 1].y + uVar30) >> 1);
                sx = vertices[lVar17 + 1].x + iVar21 >> 1;
              }
              else {
                uVar20 = (ulong)(uint)(int)vertices[lVar17 + 1].y;
                iVar12 = iVar29 + 1;
                sx = (int)vertices[lVar17 + 1].x;
              }
            }
            uVar28 = bVar23 & 1 ^ 1;
            vertices[num_vertices].type = '\x01';
            vertices[num_vertices].x = (short)sx;
            vertices[num_vertices].y = (short)uVar20;
            vertices[num_vertices].cx = 0;
            vertices[num_vertices].cy = 0;
            iVar29 = (ushort)(*(ushort *)(puVar4 + (long)iVar19 * 2 + uVar13 + 10) << 8 |
                             *(ushort *)(puVar4 + (long)iVar19 * 2 + uVar13 + 10) >> 8) + 1;
            iVar19 = iVar19 + 1;
            was_off = 0;
            local_e8._0_8_ = uVar32;
            num_vertices = num_vertices + 1;
          }
          else {
            sVar18 = (short)local_110;
            if ((bVar23 & 1) == 0) {
              local_110 = uVar31;
              if (was_off == 0) {
                was_off = 1;
                cx = iVar21;
              }
              else {
                vertices[num_vertices].type = '\x03';
                vertices[num_vertices].x = (short)((uint)(cx + iVar21) >> 1);
                vertices[num_vertices].y = (short)(uVar30 + cy >> 1);
                vertices[num_vertices].cx = (short)cx;
                vertices[num_vertices].cy = sVar18;
                was_off = 1;
                num_vertices = num_vertices + 1;
                cx = iVar21;
              }
            }
            else {
              psVar16 = vertices + num_vertices;
              if (was_off == 0) {
                psVar16->type = '\x02';
                psVar16->x = sVar24;
                psVar16->y = sVar3;
                psVar16->cx = 0;
                sVar18 = 0;
              }
              else {
                psVar16->type = '\x03';
                psVar16->x = sVar24;
                psVar16->y = sVar3;
                psVar16->cx = (short)cx;
              }
              psVar16->cy = sVar18;
              num_vertices = num_vertices + 1;
              was_off = 0;
            }
          }
          iVar12 = iVar12 + 1;
        }
        uVar11 = stbtt__close_shape(vertices,num_vertices,was_off,uVar28,sx,(stbtt_int32)uVar20,
                                    sVar22,local_e8._0_4_,cx,cy);
      }
      *pvertices = vertices;
      return uVar11;
    }
  }
  else {
    count_ctx.first_x = 0.0;
    count_ctx.first_y = 0.0;
    count_ctx.min_y = 0;
    count_ctx.max_y = 0;
    count_ctx.pvertices = (stbtt_vertex *)0x0;
    count_ctx.num_vertices = 0;
    count_ctx._52_4_ = 0;
    count_ctx.x = 0.0;
    count_ctx.y = 0.0;
    count_ctx.min_x = 0;
    count_ctx.max_x = 0;
    count_ctx.bounds = 1;
    count_ctx.started = 0;
    local_a8.min_y = 0;
    local_a8.max_y = 0;
    local_a8.pvertices = (stbtt_vertex *)0x0;
    local_a8.x = 0.0;
    local_a8.y = 0.0;
    local_a8.min_x = 0;
    local_a8.max_x = 0;
    local_a8.bounds = 0;
    local_a8.started = 0;
    local_a8.first_x = 0.0;
    local_a8.first_y = 0.0;
    local_a8.num_vertices = 0;
    local_a8._52_4_ = 0;
    iVar10 = stbtt__run_charstring(info,glyph_index,&count_ctx);
    if (iVar10 != 0) {
      local_a8.pvertices =
           (stbtt_vertex *)
           (**(code **)((long)info->userdata + 8))
                     (*info->userdata,0,(long)count_ctx.num_vertices * 0xe);
      *pvertices = local_a8.pvertices;
      iVar10 = stbtt__run_charstring(info,glyph_index,&local_a8);
      if (iVar10 != 0) {
        return local_a8.num_vertices;
      }
    }
    *pvertices = (stbtt_vertex *)0x0;
  }
  return 0;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
if (!info->cff.size)
return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
else
return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}